

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall
llvm::yaml::Input::preflightKey
          (Input *this,char *Key,bool Required,bool param_3,bool *UseDefault,void **SaveInfo)

{
  HNode *pHVar1;
  char *__s;
  bool bVar2;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6U>
  *this_00;
  NameToNode *this_01;
  unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> *this_02;
  error_code eVar3;
  Twine local_130;
  Twine local_118;
  Twine local_100;
  Twine local_e8;
  Twine local_d0;
  StringRef local_b8;
  pointer local_a8;
  HNode *Value;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Twine local_68;
  ret_type local_50;
  MapHNode *MN;
  void **local_38;
  void **SaveInfo_local;
  bool *UseDefault_local;
  bool param_3_local;
  char *pcStack_20;
  bool Required_local;
  char *Key_local;
  Input *this_local;
  
  *UseDefault = false;
  local_38 = SaveInfo;
  SaveInfo_local = (void **)UseDefault;
  UseDefault_local._6_1_ = param_3;
  UseDefault_local._7_1_ = Required;
  pcStack_20 = Key;
  Key_local = (char *)this;
  bVar2 = std::error_code::operator_cast_to_bool(&this->EC);
  if (bVar2) {
    return false;
  }
  if (this->CurrentNode == (HNode *)0x0) {
    if ((UseDefault_local._7_1_ & 1) != 0) {
      eVar3 = make_error_code(invalid_argument);
      *(ulong *)&this->EC = CONCAT44(MN._4_4_,eVar3._M_value);
      (this->EC)._M_cat = eVar3._M_cat;
    }
    return false;
  }
  local_50 = dyn_cast<llvm::yaml::Input::MapHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  __s = pcStack_20;
  if (local_50 == (ret_type)0x0) {
    if (((UseDefault_local._7_1_ & 1) != 0) ||
       (bVar2 = isa<llvm::yaml::Input::EmptyHNode,llvm::yaml::Input::HNode*>(&this->CurrentNode),
       !bVar2)) {
      pHVar1 = this->CurrentNode;
      Twine::Twine(&local_68,"not a mapping");
      setError(this,pHVar1,&local_68);
    }
    return false;
  }
  this_00 = &local_50->ValidKeys;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ::push_back((SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               *)this_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  this_01 = &local_50->Mapping;
  StringRef::StringRef(&local_b8,pcStack_20);
  this_02 = StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
            ::operator[](this_01,local_b8);
  local_a8 = std::
             unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>::
             get(this_02);
  if (local_a8 == (pointer)0x0) {
    if ((UseDefault_local._7_1_ & 1) == 0) {
      *(undefined1 *)SaveInfo_local = 1;
    }
    else {
      pHVar1 = this->CurrentNode;
      Twine::Twine(&local_100,"missing required key \'");
      Twine::Twine(&local_118,pcStack_20);
      llvm::operator+(&local_e8,&local_100,&local_118);
      Twine::Twine(&local_130,"\'");
      llvm::operator+(&local_d0,&local_e8,&local_130);
      setError(this,pHVar1,&local_d0);
    }
    return false;
  }
  *local_38 = this->CurrentNode;
  this->CurrentNode = local_a8;
  return true;
}

Assistant:

bool Input::preflightKey(const char *Key, bool Required, bool, bool &UseDefault,
                         void *&SaveInfo) {
  UseDefault = false;
  if (EC)
    return false;

  // CurrentNode is null for empty documents, which is an error in case required
  // nodes are present.
  if (!CurrentNode) {
    if (Required)
      EC = make_error_code(errc::invalid_argument);
    return false;
  }

  MapHNode *MN = dyn_cast<MapHNode>(CurrentNode);
  if (!MN) {
    if (Required || !isa<EmptyHNode>(CurrentNode))
      setError(CurrentNode, "not a mapping");
    return false;
  }
  MN->ValidKeys.push_back(Key);
  HNode *Value = MN->Mapping[Key].get();
  if (!Value) {
    if (Required)
      setError(CurrentNode, Twine("missing required key '") + Key + "'");
    else
      UseDefault = true;
    return false;
  }
  SaveInfo = CurrentNode;
  CurrentNode = Value;
  return true;
}